

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::number_base::write_decimal<long_long,std::wostream>
          (number_base *this,longlong value,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  wostream *pwVar4;
  uint uVar5;
  long lVar6;
  wostream *pwVar7;
  wostream *pwVar8;
  
  lVar6 = *(long *)(*(long *)os + -0x18);
  pwVar8 = os + lVar6 + 0x18;
  uVar1 = *(uint *)pwVar8;
  uVar2 = this->base_;
  uVar3 = uVar1;
  if (uVar2 == 8) {
    if (value != 0) {
      std::operator<<(os,"0");
      lVar6 = *(long *)(*(long *)os + -0x18);
      uVar3 = *(uint *)(os + lVar6 + 0x18);
    }
    pwVar7 = os + lVar6 + 0x18;
    uVar5 = 0x40;
  }
  else {
    uVar5 = 2;
    pwVar7 = pwVar8;
    if (uVar2 != 10) {
      if (uVar2 != 0x10) {
        assert_failed("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/dump/value.hpp"
                      ,0xa3);
      }
      pwVar4 = std::operator<<(os,"0x");
      pwVar7 = pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x18;
      uVar3 = *(uint *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0x18);
      uVar5 = 8;
    }
  }
  *(uint *)pwVar7 = uVar3 & 0xffffffb5 | uVar5;
  pwVar7 = std::wostream::_M_insert<long_long>((longlong)os);
  *(uint *)pwVar8 = uVar1;
  return pwVar7;
}

Assistant:

OStream & write_decimal (T value, OStream & os) const {
                ios_flags_saver const _{os};
                switch (base_) {
                case 16: os << "0x" << std::hex; break;
                case 8:
                    if (value != 0) {
                        os << "0";
                    }
                    os << std::oct;
                    break;
                case 10: os << std::dec; break;
                default: PSTORE_ASSERT (0); break;
                }
                return os << value;
            }